

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getDoubleOptionValues
                   (void *highs,char *option,double *current_value,double *min_value,
                   double *max_value,double *default_value)

{
  HighsStatus HVar1;
  double *in_RSI;
  double *in_RDI;
  allocator *min_value_00;
  double *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  Highs *in_stack_ffffffffffffffa8;
  string local_50 [80];
  
  min_value_00 = (allocator *)&stack0xffffffffffffffaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)in_RSI,min_value_00);
  HVar1 = Highs::getDoubleOptionValues
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (double *)min_value_00,in_RSI,in_RDI);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  return HVar1;
}

Assistant:

HighsInt Highs_getDoubleOptionValues(const void* highs, const char* option,
                                     double* current_value, double* min_value,
                                     double* max_value, double* default_value) {
  return (HighsInt)((Highs*)highs)
      ->getDoubleOptionValues(std::string(option), current_value, min_value,
                              max_value, default_value);
}